

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O0

FMOD_RESULT
XPMP2::SoundSystemFMOD::SoundLogCB
          (FMOD_DEBUG_FLAGS flags,char *file,int line,char *func,char *message)

{
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  uint in_EDI;
  undefined8 in_R8;
  uint local_44;
  
  if ((in_EDI & 1) == 0) {
    local_44 = 1;
    if ((in_EDI & 2) != 0) {
      local_44 = 2;
    }
  }
  else {
    local_44 = 3;
  }
  LogMsg(in_RSI,(int)(ulong)in_EDX,in_RCX,(logLevelTy)(ulong)local_44,"FMOD_LOG: %s",in_R8);
  return FMOD_OK;
}

Assistant:

FMOD_RESULT F_CALLBACK SoundSystemFMOD::SoundLogCB(FMOD_DEBUG_FLAGS flags,
                                                   const char * file,
                                                   int line,
                                                   const char * func,
                                                   const char *message)
{
    // Basically convert it to our standard log output
    LogMsg(file, line, func,
           flags & FMOD_DEBUG_LEVEL_ERROR   ? logERR  :
           flags & FMOD_DEBUG_LEVEL_WARNING ? logWARN : logINFO,
           "FMOD_LOG: %s", message);
    return FMOD_OK;
}